

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

word Dsd_TreeFunc2Truth_rec(DdManager *dd,DdNode *bFunc)

{
  uint uVar1;
  word wVar2;
  ulong uVar3;
  DdNode *pDVar4;
  ulong uVar5;
  word wVar6;
  
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar4 == bFunc) {
    wVar6 = 0;
  }
  else {
    uVar3 = 0;
    uVar5 = 0;
    do {
      if (dd->one == bFunc) {
        uVar3 = 0xffffffffffffffff;
        break;
      }
      if (((ulong)bFunc & 1) == 0) {
        uVar1 = dd->perm[bFunc->index];
        if (5 < (ulong)uVar1) {
          __assert_fail("Level >= 0 && Level < 6",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                        ,0x350,"word Dsd_TreeFunc2Truth_rec(DdManager *, DdNode *)");
        }
        wVar6 = Dsd_TreeFunc2Truth_rec(dd,(bFunc->type).kids.E);
        wVar2 = Dsd_TreeFunc2Truth_rec(dd,(bFunc->type).kids.T);
        uVar3 = (wVar2 ^ wVar6) & s_Truths6[uVar1];
        uVar5 = uVar5 ^ wVar6;
        break;
      }
      bFunc = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
      uVar5 = ~uVar5;
    } while (pDVar4 != bFunc);
    wVar6 = uVar5 ^ uVar3;
  }
  return wVar6;
}

Assistant:

word Dsd_TreeFunc2Truth_rec( DdManager * dd, DdNode * bFunc )
{
    word Cof0, Cof1;
    int Level;
    if ( bFunc == b0 )
        return 0;
    if ( bFunc == b1 )
        return ~(word)0;
    if ( Cudd_IsComplement(bFunc) )
        return ~Dsd_TreeFunc2Truth_rec( dd, Cudd_Not(bFunc) );
    Level = dd->perm[bFunc->index];
    assert( Level >= 0 && Level < 6 );
    Cof0 = Dsd_TreeFunc2Truth_rec( dd, cuddE(bFunc) );
    Cof1 = Dsd_TreeFunc2Truth_rec( dd, cuddT(bFunc) );
    return (s_Truths6[Level] & Cof1) | (~s_Truths6[Level] & Cof0);
}